

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DemoScripts.cpp
# Opt level: O0

void __thiscall DemoScripts::RunDummyModel(DemoScripts *this)

{
  initializer_list<float> __l;
  bool bVar1;
  reference pfVar2;
  ostream *poVar3;
  iterator iStack_120;
  float activation;
  iterator __end1;
  iterator __begin1;
  vector<float,_std::allocator<float>_> *__range1;
  float local_100 [4];
  iterator local_f0;
  size_type local_e8;
  vector<float,_std::allocator<float>_> local_e0;
  allocator<float> local_c1;
  undefined1 local_c0 [8];
  vector<float,_std::allocator<float>_> output;
  undefined1 local_98 [8];
  BasicNetwork<LifNeuron,_LifSynapse,_PreciseEventManager> model;
  int OUTPUT_SIZE;
  int INPUT_SIZE;
  DemoScripts *this_local;
  
  model.size._4_4_ = 1;
  model.size._0_4_ = 1;
  BasicNetwork<LifNeuron,_LifSynapse,_PreciseEventManager>::BasicNetwork
            ((BasicNetwork<LifNeuron,_LifSynapse,_PreciseEventManager> *)local_98,1,1,true);
  BasicNetwork<LifNeuron,_LifSynapse,_PreciseEventManager>::AddLink
            ((BasicNetwork<LifNeuron,_LifSynapse,_PreciseEventManager> *)local_98,0,1,100.0,0.1);
  BasicNetwork<LifNeuron,_LifSynapse,_PreciseEventManager>::AddLink
            ((BasicNetwork<LifNeuron,_LifSynapse,_PreciseEventManager> *)local_98,0,2,100.0,0.15);
  BasicNetwork<LifNeuron,_LifSynapse,_PreciseEventManager>::AddLink
            ((BasicNetwork<LifNeuron,_LifSynapse,_PreciseEventManager> *)local_98,0,3,100.0,0.05);
  BasicNetwork<LifNeuron,_LifSynapse,_PreciseEventManager>::AddLink
            ((BasicNetwork<LifNeuron,_LifSynapse,_PreciseEventManager> *)local_98,0,4,100.0,0.2);
  std::allocator<float>::allocator(&local_c1);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_c0,1,&local_c1);
  std::allocator<float>::~allocator(&local_c1);
  local_100[0] = 0.5;
  local_100[1] = 100.0;
  local_100[2] = 100.0;
  local_100[3] = 100.0;
  local_f0 = local_100;
  local_e8 = 4;
  std::allocator<float>::allocator((allocator<float> *)((long)&__range1 + 7));
  __l._M_len = local_e8;
  __l._M_array = local_f0;
  std::vector<float,_std::allocator<float>_>::vector
            (&local_e0,__l,(allocator<float> *)((long)&__range1 + 7));
  INetwork::Forward((INetwork *)local_98,&local_e0,(vector<float,_std::allocator<float>_> *)local_c0
                    ,4.0);
  std::vector<float,_std::allocator<float>_>::~vector(&local_e0);
  std::allocator<float>::~allocator((allocator<float> *)((long)&__range1 + 7));
  __end1 = std::vector<float,_std::allocator<float>_>::begin
                     ((vector<float,_std::allocator<float>_> *)local_c0);
  iStack_120 = std::vector<float,_std::allocator<float>_>::end
                         ((vector<float,_std::allocator<float>_> *)local_c0);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xfffffffffffffee0);
    if (!bVar1) break;
    pfVar2 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(&__end1);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,*pfVar2);
    std::operator<<(poVar3," ");
    __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::operator++
              (&__end1);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_c0);
  BasicNetwork<LifNeuron,_LifSynapse,_PreciseEventManager>::~BasicNetwork
            ((BasicNetwork<LifNeuron,_LifSynapse,_PreciseEventManager> *)local_98);
  return;
}

Assistant:

void DemoScripts::RunDummyModel()
{
    const int INPUT_SIZE = 1;
    const int OUTPUT_SIZE = 1;
    auto model = BasicNetwork<LifNeuron, LifSynapse, PreciseEventManager>( INPUT_SIZE, OUTPUT_SIZE, true );

    model.AddLink( 0, 1, 100, 0.1 );
    model.AddLink( 0, 2, 100, 0.15 );
    model.AddLink( 0, 3, 100, 0.05 );
    model.AddLink( 0, 4, 100, 0.2 );

    std::vector<float> output( OUTPUT_SIZE );

    model.Forward( {0.5, 100, 100, 100}, output, 4 );

    for ( auto activation: output ) {
        std::cout << activation << " ";
    }
    std::cout << "\n";
}